

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O3

MPP_RET hal_jpege_vepu2_get_task(void *hal,HalEncTask *task)

{
  MppBufferGroup *group;
  undefined8 uVar1;
  int iVar2;
  EncRcTask *pEVar3;
  RK_U32 RVar4;
  int iVar5;
  size_t sVar6;
  undefined4 *puVar7;
  void *pvVar8;
  long lVar9;
  sbyte sVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  void *__src;
  MppBuffer local_48;
  uint local_40;
  uint local_3c;
  void *local_38;
  
  __src = (task->syntax).data;
  puVar7 = *(undefined4 **)((long)hal + 0x170);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter hal %p\n","hal_jpege_vepu2_get_task",hal);
  }
  RVar4 = hal_jpege_debug;
  memcpy((void *)((long)hal + 0x40),__src,0xb8);
  if ((RVar4 & 0x10) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","rc_mode %d\n",(char *)0x0,
               (ulong)*(uint *)(*(long *)((long)hal + 0x38) + 0x94));
  }
  if (*(int *)(*(long *)((long)hal + 0x38) + 0x94) != 2) {
    if (*(int *)((long)hal + 0x130) == 0) {
      iVar5 = 0x50;
      if (*(int *)((long)__src + 0x44) != 0) {
        iVar5 = 100 - *(int *)((long)__src + 0x44);
      }
      pEVar3 = task->rc_task;
      (pEVar3->info).quality_target = iVar5;
      uVar1 = *(undefined8 *)((long)__src + 0x48);
      (pEVar3->info).quality_max = 100 - (int)uVar1;
      (pEVar3->info).quality_min = 100 - (int)((ulong)uVar1 >> 0x20);
      *(byte *)&pEVar3->frm = *(byte *)&pEVar3->frm | 0x10;
    }
    else {
      pEVar3 = task->rc_task;
      (pEVar3->info).quality_target = *(RK_S32 *)((long)hal + 0x148);
      uVar1 = *(undefined8 *)((long)__src + 0x48);
      (pEVar3->info).quality_max = 100 - (int)uVar1;
      (pEVar3->info).quality_min = 100 - (int)((ulong)uVar1 >> 0x20);
    }
  }
  sVar6 = mpp_packet_get_length(task->packet);
  *(int *)((long)hal + 0x150) = (int)sVar6;
  *(undefined4 *)((long)hal + 0x104) = 0;
  *(undefined4 *)((long)hal + 0x100) = *(undefined4 *)((long)__src + 0x14);
  *(undefined4 *)((long)hal + 0x128) = 0;
  *(undefined1 (*) [16])((long)hal + 0x118) = (undefined1  [16])0x0;
  task->part_first = 1;
  task->part_last = 0;
  (task->flags).reg_idx = 0;
  iVar5 = *(int *)((long)hal + 0x2c);
  if (1 < iVar5) {
    iVar2 = *(int *)((long)hal + 0x30);
    iVar14 = iVar2 + 1;
    *(int *)((long)hal + 0x30) = iVar14;
    (task->flags).reg_idx = iVar2;
    if (iVar5 <= iVar14) {
      *(undefined4 *)((long)hal + 0x30) = 0;
    }
    goto LAB_002493da;
  }
  if (puVar7 != (undefined4 *)0x0) {
    *puVar7 = 0;
  }
  if (*(int *)((long)hal + 8) != 0x13) goto LAB_002493da;
  uVar12 = *(uint *)(*(long *)((long)hal + 0x38) + 0xc);
  uVar13 = *(uint *)(*(long *)((long)hal + 0x38) + 0x10);
  if ((uVar13 * uVar12 < 0xe1001) && (uVar12 < 0x2d1 || uVar13 < 0x2d1)) goto LAB_002493da;
  local_3c = uVar12;
  if (puVar7 == (undefined4 *)0x0) {
    puVar7 = (undefined4 *)mpp_osal_calloc("hal_jpege_vepu2_get_task",0xa0);
    *(undefined4 **)((long)hal + 0x170) = puVar7;
    if (puVar7 == (undefined4 *)0x0) {
      puVar7 = (undefined4 *)0x0;
      _mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx_ext",
                 "hal_jpege_vepu2_get_task",0xdd);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0024941b;
    }
  }
  group = (MppBufferGroup *)(puVar7 + 4);
  if ((((*(long *)(puVar7 + 4) == 0) &&
       (mpp_buffer_group_get
                  (group,0x20004,MPP_BUFFER_INTERNAL,"hal_jpege_vepu2","hal_jpege_vepu2_get_task"),
       *group == (MppBufferGroup)0x0)) &&
      (mpp_buffer_group_get
                 (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_jpege_vepu2",
                  "hal_jpege_vepu2_get_task"), *group == (MppBufferGroup)0x0)) &&
     (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "ctx_ext->partions_group","hal_jpege_vepu2_get_task",0xe5),
     (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_0024941b:
    abort();
  }
  uVar12 = uVar13 * uVar12 >> 1;
  if (puVar7[0xc] != uVar12) {
    lVar15 = 0;
    local_38 = __src;
    do {
      local_48 = *(MppBuffer *)(puVar7 + lVar15 * 2 + 6);
      if (local_48 != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(local_48,"hal_jpege_vepu2_get_task");
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    mpp_buffer_group_clear(*group);
    lVar15 = 0;
    local_40 = uVar12;
    do {
      mpp_buffer_get_with_tag
                (*group,&local_48,(ulong)uVar12,"hal_jpege_vepu2","hal_jpege_vepu2_get_task");
      if ((local_48 == (MppBuffer)0x0) &&
         (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"buf",
                     "hal_jpege_vepu2_get_task",0xf4), (mpp_debug._3_1_ & 0x10) != 0))
      goto LAB_0024941b;
      *(MppBuffer *)(puVar7 + lVar15 * 2 + 6) = local_48;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    puVar7[0xc] = local_40;
    __src = local_38;
  }
  if (*(long *)(puVar7 + 0x16) == 0) {
    pvVar8 = mpp_osal_calloc("hal_jpege_vepu2_get_task",
                             (ulong)(uint)(*(int *)((long)hal + 0x28) << 3));
    uVar12 = *(uint *)((long)hal + 0x28);
    *(void **)(puVar7 + 0x16) = pvVar8;
    lVar15 = -4;
    do {
      *(void **)(puVar7 + lVar15 * 2 + 0x20) = pvVar8;
      lVar9 = (long)pvVar8 + (ulong)uVar12;
      *(long *)(puVar7 + lVar15 * 2 + 0x28) = lVar9;
      pvVar8 = (void *)(lVar9 + (ulong)uVar12);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0);
  }
  uVar12 = uVar13 + 0xf >> 4;
  puVar7[1] = 0;
  if (*(int *)(*(long *)((long)hal + 0x38) + 0xe94) == 2) {
    uVar12 = ((uVar12 + *(uint *)((long)__src + 0x9c)) - 1) / *(uint *)((long)__src + 0x9c);
    if (uVar12 - 0x19 < 0xfffffff0) {
      iVar5 = 1;
      if (0x18 < uVar12) {
        iVar5 = 8;
      }
      sVar10 = (0x18 < uVar12) * '\x03';
      uVar13 = uVar12 >> sVar10;
      if (3 < uVar13) {
        iVar14 = (uVar13 >> 2) << sVar10;
        puVar7[0x11] = iVar14;
        puVar7[0x12] = iVar14;
        puVar7[0x13] = iVar14;
        puVar7[0x14] = iVar14;
      }
      if ((uVar13 & 3) != 0) {
        uVar11 = 0;
        do {
          puVar7[uVar11 + 0x11] = puVar7[uVar11 + 0x11] + iVar5;
          uVar11 = uVar11 + 1;
        } while ((uVar13 & 3) != uVar11);
      }
      puVar7[0x14] = puVar7[0x14] + (iVar5 - 1U & uVar12);
    }
    else {
      if (uVar12 < 0x15) {
        if (uVar12 < 0x11) {
          *(undefined8 *)(puVar7 + 0x11) = 0x400000004;
          uVar12 = uVar12 - 8;
          goto LAB_00249340;
        }
        *(undefined8 *)(puVar7 + 0x11) = 0x400000008;
        puVar7[0x13] = 4;
        iVar5 = uVar12 - 0x10;
      }
      else {
        *(undefined8 *)(puVar7 + 0x11) = 0x800000008;
        uVar12 = uVar12 - 0x10;
LAB_00249340:
        puVar7[0x13] = uVar12 >> 1;
        iVar5 = uVar12 - (uVar12 >> 1);
      }
      puVar7[0x14] = iVar5;
    }
    uVar11 = 0;
    do {
      uVar12 = puVar7[uVar11 + 0x11];
      iVar5 = *(int *)((long)__src + 0x9c) * uVar12;
      puVar7[uVar11 + 0xd] = iVar5;
      if ((hal_jpege_debug & 4) != 0) {
        _mpp_log_l(4,"hal_jpege_vepu2","part %d, ecs %d, rows %d",(char *)0x0,uVar11 & 0xffffffff,
                   (ulong)uVar12,iVar5);
        uVar12 = puVar7[uVar11 + 0x11];
      }
      if (uVar12 != 0) {
        puVar7[1] = puVar7[1] + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
  }
  else {
    uVar16 = local_3c + 0xf >> 4;
    uVar13 = uVar12 + 3 >> 2;
    uVar11 = 0;
    do {
      if (uVar12 < uVar13) {
        uVar13 = uVar12;
      }
      puVar7[uVar11 + 0xd] = uVar13;
      puVar7[uVar11 + 0x11] = 1;
      if ((hal_jpege_debug & 4) != 0) {
        _mpp_log_l(4,"hal_jpege_vepu2","part %d row %d restart %d\n",(char *)0x0,uVar11 & 0xffffffff
                   ,(ulong)uVar13,uVar13 * uVar16);
      }
      if (uVar13 != 0) {
        puVar7[1] = puVar7[1] + 1;
      }
      if ((uVar11 == 0) && (*(int *)((long)hal + 0xe0) == 0)) {
        *(uint *)((long)hal + 0xe0) = uVar13 * uVar16;
      }
      uVar12 = uVar12 - uVar13;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
  }
  if (*(long *)(puVar7 + 2) == 0) {
    mpp_dev_multi_offset_init((MppDevRegOffCfgs **)(puVar7 + 2),0x18);
  }
  *(undefined4 *)((long)__src + 0x98) = 1;
  *puVar7 = 1;
LAB_002493da:
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave hal %p\n","hal_jpege_vepu2_get_task",hal);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu2_get_task(void *hal, HalEncTask *task)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeSyntax *syntax = (JpegeSyntax *)task->syntax.data;
    JpegeMultiCoreCtx *ctx_ext = (JpegeMultiCoreCtx *)ctx->ctx_ext;
    RK_U32 i = 0;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    memcpy(&ctx->syntax, syntax, sizeof(ctx->syntax));
    /* Set rc paramters */
    hal_jpege_dbg_input("rc_mode %d\n", ctx->cfg->rc.rc_mode);
    if (ctx->cfg->rc.rc_mode != MPP_ENC_RC_MODE_FIXQP) {
        if (!ctx->hal_rc.q_factor) {
            task->rc_task->info.quality_target = syntax->q_factor ? (100 - syntax->q_factor) : 80;
            task->rc_task->info.quality_min = 100 - syntax->qf_max;
            task->rc_task->info.quality_max = 100 - syntax->qf_min;
            task->rc_task->frm.is_intra = 1;
        } else {
            task->rc_task->info.quality_target = ctx->hal_rc.last_quality;
            task->rc_task->info.quality_min = 100 - syntax->qf_max;
            task->rc_task->info.quality_max = 100 - syntax->qf_min;
        }
    }
    ctx->hal_start_pos = mpp_packet_get_length(task->packet);

    /* prepare for part encoding */
    ctx->mcu_y = 0;
    ctx->mcu_h = syntax->mcu_ver_cnt;
    ctx->sw_bit = 0;
    ctx->part_bytepos = 0;
    ctx->part_x_fill = 0;
    ctx->part_y_fill = 0;
    ctx->rst_marker_idx = 0;
    task->part_first = 1;
    task->part_last = 0;
    task->flags.reg_idx = 0;

    /* rk3588 4 core frame parallel */
    if (ctx->task_cnt > 1) {
        task->flags.reg_idx = ctx->task_idx++;
        if (ctx->task_idx >= ctx->task_cnt)
            ctx->task_idx = 0;
        goto MULTI_CORE_SPLIT_DONE;
    }

    /* Split single task to multi cores on rk3588 */
    if (ctx_ext)
        ctx_ext->multi_core_enabled = 0;

    if (ctx->type == VPU_CLIENT_VEPU2_JPEG) {
        RK_U32 width = ctx->cfg->prep.width;
        RK_U32 height = ctx->cfg->prep.height;
        RK_U32 buf_size = width * height / 2;

        /* small image do not need to split into four segments */
        if (width * height <= 1280 * 720 && (height <= 720 || width <= 720))
            goto MULTI_CORE_SPLIT_DONE;

        if (!ctx_ext) {
            ctx_ext = mpp_calloc(JpegeMultiCoreCtx, 1);
            ctx->ctx_ext = ctx_ext;
        }

        mpp_assert(ctx_ext);

        if (!ctx_ext->partions_group) {
            mpp_buffer_group_get_internal(&ctx_ext->partions_group, MPP_BUFFER_TYPE_DMA_HEAP | MPP_BUFFER_FLAGS_CACHABLE);
            if (!ctx_ext->partions_group)
                mpp_buffer_group_get_internal(&ctx_ext->partions_group, MPP_BUFFER_TYPE_ION);
        }

        mpp_assert(ctx_ext->partions_group);

        if (ctx_ext->buf_size != buf_size) {
            MppBuffer buf = NULL;

            for (i = 0; i < MAX_CORE_NUM - 1; i++) {
                buf = ctx_ext->partions_buf[i];
                if (buf)
                    mpp_buffer_put(buf);
            }

            mpp_buffer_group_clear(ctx_ext->partions_group);

            for (i = 0; i < MAX_CORE_NUM - 1; i++) {
                mpp_buffer_get(ctx_ext->partions_group, &buf, buf_size);
                mpp_assert(buf);
                ctx_ext->partions_buf[i] = buf;
            }

            ctx_ext->buf_size = buf_size;
        }

        if (!ctx_ext->regs_base) {
            void *regs_base = mpp_calloc_size(void, ctx->reg_size * MAX_CORE_NUM * 2);
            size_t reg_size = ctx->reg_size;

            ctx_ext->regs_base = regs_base;
            for (i = 0; i < MAX_CORE_NUM; i++) {
                ctx_ext->regs[i] = regs_base;
                regs_base += reg_size;

                ctx_ext->regs_out[i] = regs_base;
                regs_base += reg_size;
            }
        }

        {
            RK_U32 mb_w = MPP_ALIGN(width, 16) / 16;
            RK_U32 mb_h = MPP_ALIGN(height, 16) / 16;
            RK_U32 part_rows = MPP_ALIGN(mb_h, 4) / 4;

            ctx_ext->partion_num = 0;

            if (ctx->cfg->split.split_mode == MPP_ENC_SPLIT_BY_CTU) {
                RK_U32 ecs_num = (mb_h + syntax->part_rows - 1) / syntax->part_rows;
                RK_U32 *core_ecs = ctx_ext->ecs_cnt;

                if (ecs_num > 24 || ecs_num <= 8) {
                    RK_U32 divider = ecs_num > 24 ? 8 : 1;
                    RK_U32 quotient = ecs_num / divider;
                    RK_U32 remainder = ecs_num % divider;
                    RK_U32 runs = quotient  / MAX_CORE_NUM;
                    RK_U32 runs_left = quotient % MAX_CORE_NUM;

                    if (runs > 0) {
                        for (i = 0; i < MAX_CORE_NUM; i++)
                            core_ecs[i] = runs * divider;
                    }

                    for (i = 0; i < runs_left; i++)
                        core_ecs[i] += divider;

                    core_ecs[MAX_CORE_NUM - 1] += remainder;
                } else if (ecs_num > 20) {
                    core_ecs[0] = core_ecs[1] = 8;
                    core_ecs[2] = (ecs_num - 8 * 2) / 2;
                    core_ecs[3] = ecs_num - 8 * 2 - core_ecs[2];
                } else if (ecs_num > 16) {
                    core_ecs[0] = 8;
                    core_ecs[1] = core_ecs[2] = 4;
                    core_ecs[3] = ecs_num - 8 - 4 * 2;
                } else if (ecs_num > 8) {
                    core_ecs[0] = core_ecs[1] = 4;
                    core_ecs[2] = (ecs_num - 4 * 2) / 2;
                    core_ecs[3] = ecs_num - 4 * 2 - core_ecs[2];
                }

                for (i = 0; i < MAX_CORE_NUM; i++) {
                    ctx_ext->part_rows[i] = core_ecs[i] * syntax->part_rows;
                    hal_jpege_dbg_detail("part %d, ecs %d, rows %d", i, core_ecs[i],
                                         ctx_ext->part_rows[i]);
                    if (core_ecs[i])
                        ctx_ext->partion_num++;
                }
            } else {
                for (i = 0; i < MAX_CORE_NUM; i++) {
                    part_rows = (mb_h >= part_rows) ? part_rows : mb_h;

                    ctx_ext->part_rows[i] = part_rows;
                    ctx_ext->ecs_cnt[i] = 1;

                    hal_jpege_dbg_detail("part %d row %d restart %d\n",
                                         i, part_rows, mb_w * part_rows);

                    if (part_rows)
                        ctx_ext->partion_num++;

                    if (i == 0 && !ctx->syntax.restart_ri)
                        ctx->syntax.restart_ri = mb_w * part_rows;

                    mb_h -= part_rows;
                }
            }
        }

        if (!ctx_ext->reg_cfg)
            mpp_dev_multi_offset_init(&ctx_ext->reg_cfg, 24);

        syntax->low_delay = 1;
        ctx_ext->multi_core_enabled = 1;
    }
MULTI_CORE_SPLIT_DONE:

    hal_jpege_dbg_func("leave hal %p\n", hal);

    return MPP_OK;
}